

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O3

int __thiscall
FuzzingParameterSet::get_random_even_divisior(FuzzingParameterSet *this,int n,int min_value)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int *e;
  int *piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  uint uVar5;
  string local_90;
  string local_70;
  double local_50;
  int *piStack_48;
  vector<int,_std::allocator<int>_> divisors;
  
  piStack_48 = (int *)0x0;
  divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_50 = (double)n;
  local_70._M_dataplus._M_p._0_4_ = 1;
  if (local_50 < 0.0) {
    dVar1 = sqrt(local_50);
  }
  else {
    dVar1 = SQRT(local_50);
  }
  if (1.0 <= dVar1) {
    dVar1 = SQRT(local_50);
    do {
      if (n % (int)(uint)local_70._M_dataplus._M_p == 0) {
        if ((((uint)local_70._M_dataplus._M_p & 1) == 0) &&
           (n / (int)(uint)local_70._M_dataplus._M_p == 1)) {
          if (divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start ==
              divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&piStack_48,
                       (iterator)
                       divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(int *)&local_70);
          }
          else {
            *divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = (uint)local_70._M_dataplus._M_p;
LAB_0013788c:
            divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
          }
        }
        else {
          if (((uint)local_70._M_dataplus._M_p & 1) == 0) {
            if (divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&piStack_48,
                         (iterator)
                         divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,(int *)&local_70);
            }
            else {
              *divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = (uint)local_70._M_dataplus._M_p;
              divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 1;
            }
          }
          if (((long)n / (long)(int)(uint)local_70._M_dataplus._M_p & 1U) == 0) {
            iVar3 = (int)((long)n / (long)(int)(uint)local_70._M_dataplus._M_p);
            local_90._M_dataplus._M_p._0_4_ = iVar3;
            if (divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              *divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = iVar3;
              goto LAB_0013788c;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&piStack_48,
                       (iterator)
                       divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(int *)&local_90);
          }
        }
      }
      uVar5 = (uint)local_70._M_dataplus._M_p + 1;
      local_70._M_dataplus._M_p._0_4_ = uVar5;
      dVar2 = dVar1;
      if (local_50 < 0.0) {
        dVar2 = sqrt(local_50);
      }
      __last._M_current =
           divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      __first._M_current = piStack_48;
    } while ((double)(int)uVar5 <= dVar2);
  }
  else {
    __last._M_current = (int *)0x0;
    __first._M_current = (int *)0x0;
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (__first,__last,&this->gen);
  for (piVar4 = piStack_48;
      piVar4 != divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar4 = piVar4 + 1) {
    iVar3 = *piVar4;
    if (min_value <= *piVar4) goto LAB_00137994;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Could not determine a random even divisor of n=%d. Using n.","");
  format_string<int>(&local_70,&local_90,n);
  Logger::log_error(&local_70,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p) !=
      &local_70.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p),
                    local_70.field_2._M_allocated_capacity + 1);
  }
  iVar3 = n;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_00137994:
  if (piStack_48 != (int *)0x0) {
    operator_delete(piStack_48,
                    (long)divisors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piStack_48);
  }
  return iVar3;
}

Assistant:

int FuzzingParameterSet::get_random_even_divisior(int n, int min_value) {
  std::vector<int> divisors;
  for (auto i = 1; i <= sqrt(n); i++) {
    if (n%i==0) {
      if ((n/i)==1 && (i%2)==0) {
        divisors.push_back(i);
      } else {
        if (i%2==0) divisors.push_back(i);
        if ((n/i)%2==0) divisors.push_back(n/i);
      }
    }
  }

  std::shuffle(divisors.begin(), divisors.end(), gen);
  for (const auto &e : divisors) {
    if (e >= min_value) return e;
  }

  Logger::log_error(format_string("Could not determine a random even divisor of n=%d. Using n.", n));
  return n;
}